

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O3

void vrna_exp_params_subst(vrna_fold_compound_t *vc,vrna_exp_param_t *params)

{
  uint n_seq;
  vrna_exp_param_t *pvVar1;
  vrna_md_t md;
  vrna_md_t vStack_808;
  
  if (vc != (vrna_fold_compound_t *)0x0) {
    if (vc->exp_params != (vrna_exp_param_t *)0x0) {
      free(vc->exp_params);
    }
    if (params == (vrna_exp_param_t *)0x0) {
      if (vc->type == VRNA_FC_TYPE_COMPARATIVE) {
        n_seq = (vc->field_23).field_1.n_seq;
        vrna_md_set_default(&vStack_808);
        pvVar1 = get_exp_params_ali(&vStack_808,n_seq,-1.0);
        vc->exp_params = pvVar1;
      }
      else if (vc->type == VRNA_FC_TYPE_SINGLE) {
        vrna_md_set_default(&vStack_808);
        pvVar1 = get_scaled_exp_params(&vStack_808,-1.0);
        vc->exp_params = pvVar1;
        if (1 < vc->strands) {
          (pvVar1->model_details).min_loop_size = 0;
        }
      }
    }
    else {
      pvVar1 = (vrna_exp_param_t *)vrna_alloc(0x66760);
      memcpy(pvVar1,params,0x66760);
      vc->exp_params = pvVar1;
    }
    vrna_exp_params_rescale(vc,(double *)0x0);
  }
  return;
}

Assistant:

PUBLIC void
vrna_exp_params_subst(vrna_fold_compound_t  *vc,
                      vrna_exp_param_t      *params)
{
  if (vc) {
    if (vc->exp_params)
      free(vc->exp_params);

    if (params) {
      vc->exp_params = vrna_exp_params_copy(params);
    } else {
      switch (vc->type) {
        case VRNA_FC_TYPE_SINGLE:
          vc->exp_params = vrna_exp_params(NULL);
          if (vc->strands > 1)
            vc->exp_params->model_details.min_loop_size = 0;

          break;

        case VRNA_FC_TYPE_COMPARATIVE:
          vc->exp_params = vrna_exp_params_comparative(vc->n_seq, NULL);
          break;

        default:
          break;
      }
    }

    /* fill additional helper arrays for scaling etc. */
    vrna_exp_params_rescale(vc, NULL);
  }
}